

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<int,QList<int>>::emplace_helper<QList<int>>
          (QHash<int,QList<int>> *this,int *key,QList<int> *args)

{
  Data *pDVar1;
  int *piVar2;
  qsizetype qVar3;
  piter pVar4;
  Node<int,QList<int>> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<int,_QList<int>_>_>::findOrInsert<int>
            ((InsertionResult *)local_38,*(Data<QHashPrivate::Node<int,_QList<int>_>_> **)this,key);
  this_00 = (Node<int,QList<int>> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    *(int *)this_00 = *key;
    pDVar1 = (args->d).d;
    (args->d).d = (Data *)0x0;
    *(Data **)(this_00 + 8) = pDVar1;
    piVar2 = (args->d).ptr;
    (args->d).ptr = (int *)0x0;
    *(int **)(this_00 + 0x10) = piVar2;
    qVar3 = (args->d).size;
    (args->d).size = 0;
    *(qsizetype *)(this_00 + 0x18) = qVar3;
  }
  else {
    QHashPrivate::Node<int,QList<int>>::emplaceValue<QList<int>>(this_00,args);
  }
  pVar4.bucket = local_38._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<int,_QList<int>_>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }